

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
 __thiscall
density_examples::operator+
          (density_examples *this,
          any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
          *i_first,any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
                   *i_second)

{
  bool bVar1;
  type_info *ptVar2;
  type_info *__arg;
  runtime_error *this_00;
  void *extraout_RDX;
  any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
  aVar3;
  anon_class_16_2_69c16867 local_30;
  
  ptVar2 = any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
           ::type(i_first);
  __arg = any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
          ::type(i_second);
  bVar1 = std::type_info::operator!=(ptVar2,__arg);
  if (!bVar1) {
    ptVar2 = any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
             ::type(i_first);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&void::typeinfo);
    if (!bVar1) {
      local_30.i_first = i_first;
      local_30.i_second = i_second;
      any<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density::f_istream,density::f_ostream,density_examples::f_sum>
      ::operator+((any<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density::f_istream,density::f_ostream,density_examples::f_sum>
                   *)this,&i_first->m_type,&local_30);
      aVar3.m_object = extraout_RDX;
      aVar3.m_type.m_feature_table = (tuple_type *)this;
      return aVar3;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Mismatching types");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

any<FEATURES...> operator+(const any<FEATURES...> & i_first, const any<FEATURES...> & i_second)
    {
        using namespace density;
        static_assert( // for simplicity we don't SFINAE
          density::has_features<feature_list<FEATURES...>, f_sum>::value,
          "The provided any leaks the feature sum_impl");

        if (i_first.type() != i_second.type() || i_first.type() == typeid(void))
            throw std::runtime_error("Mismatching types");

        return any<FEATURES...>(i_first.get_runtime_type(), [&](void * i_dest) {
            i_first.template get_type_feature<f_sum>()(
              i_dest, i_first.object_ptr(), i_second.object_ptr());
        });
    }